

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void solve_l2r_l1l2_svr(problem *prob,double *w,parameter *param,int solver_type)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  double *pdVar6;
  feature_node **ppfVar7;
  feature_node *pfVar8;
  feature_node *pfVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  void *__s;
  void *pvVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double local_d0;
  double local_c8;
  
  iVar3 = prob->l;
  uVar20 = (ulong)iVar3;
  dVar24 = param->eps;
  dVar28 = param->C;
  dVar1 = param->p;
  uVar16 = prob->n;
  uVar18 = uVar20 * 4;
  if ((long)uVar20 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  uVar17 = 0xffffffffffffffff;
  if ((long)uVar20 >= 0) {
    uVar17 = uVar20 * 8;
  }
  pvVar12 = operator_new__(uVar18);
  __s = operator_new__(uVar17);
  pvVar13 = operator_new__(uVar17);
  dVar22 = 0.0;
  if (solver_type != 0xd) {
    dVar22 = 0.5 / dVar28;
    dVar28 = INFINITY;
  }
  pdVar6 = prob->y;
  if (0 < (long)uVar20) {
    memset(__s,0,uVar20 * 8);
  }
  if (0 < (int)uVar16) {
    memset(w,0,(ulong)uVar16 * 8);
  }
  if (0 < iVar3) {
    ppfVar7 = prob->x;
    uVar18 = 0;
    do {
      *(undefined8 *)((long)pvVar13 + uVar18 * 8) = 0;
      iVar11 = ppfVar7[uVar18]->index;
      if (iVar11 != -1) {
        dVar23 = *(double *)((long)__s + uVar18 * 8);
        dVar25 = *(double *)((long)pvVar13 + uVar18 * 8);
        pfVar8 = ppfVar7[uVar18];
        do {
          dVar31 = pfVar8->value;
          dVar25 = dVar25 + dVar31 * dVar31;
          *(double *)((long)pvVar13 + uVar18 * 8) = dVar25;
          w[(long)iVar11 + -1] = dVar31 * dVar23 + w[(long)iVar11 + -1];
          iVar11 = pfVar8[1].index;
          pfVar8 = pfVar8 + 1;
        } while (iVar11 != -1);
      }
      *(int *)((long)pvVar12 + uVar18 * 4) = (int)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar20);
  }
  dVar31 = -dVar28;
  dVar25 = -1.0;
  uVar18 = uVar20;
  dVar23 = INFINITY;
  uVar10 = 0;
  do {
    if (0 < (int)uVar18) {
      uVar17 = uVar18 & 0xffffffff;
      lVar21 = 0;
      do {
        iVar11 = rand();
        lVar14 = iVar11 % (int)uVar17 + lVar21;
        uVar4 = *(undefined4 *)((long)pvVar12 + lVar21 * 4);
        *(undefined4 *)((long)pvVar12 + lVar21 * 4) = *(undefined4 *)((long)pvVar12 + lVar14 * 4);
        *(undefined4 *)((long)pvVar12 + lVar14 * 4) = uVar4;
        lVar21 = lVar21 + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    if ((int)uVar18 < 1) {
      local_d0 = 0.0;
      local_c8 = 0.0;
    }
    else {
      ppfVar7 = prob->x;
      local_c8 = 0.0;
      iVar11 = 0;
      local_d0 = 0.0;
      do {
        iVar5 = *(int *)((long)pvVar12 + (long)iVar11 * 4);
        lVar21 = (long)iVar5;
        dVar2 = *(double *)((long)__s + lVar21 * 8);
        dVar27 = dVar22 * dVar2 - pdVar6[lVar21];
        pfVar8 = ppfVar7[lVar21];
        iVar19 = pfVar8->index;
        pfVar9 = pfVar8;
        while (iVar19 != -1) {
          dVar27 = dVar27 + pfVar9->value * w[(long)iVar19 + -1];
          iVar19 = pfVar9[1].index;
          pfVar9 = pfVar9 + 1;
        }
        dVar29 = *(double *)((long)pvVar13 + lVar21 * 8) + dVar22;
        dVar26 = dVar1 + dVar27;
        dVar27 = dVar27 - dVar1;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if (dVar2 < dVar28) {
            if (dVar2 <= dVar31) {
              dVar30 = dVar27;
              if (dVar27 < 0.0) goto LAB_00109f8e;
              dVar30 = 0.0;
              if (dVar23 < dVar27) goto LAB_0010a0cf;
            }
            else {
              dVar30 = dVar27;
              if (0.0 < dVar2) {
                dVar30 = dVar26;
              }
              dVar30 = ABS(dVar30);
            }
          }
          else {
            dVar30 = dVar26;
            if ((dVar26 <= 0.0) && (dVar30 = 0.0, dVar26 < -dVar23)) goto LAB_0010a0cf;
          }
LAB_0010a006:
          if (dVar2 * dVar29 <= dVar26) {
            if (dVar27 <= dVar2 * dVar29) {
              dVar29 = -dVar2;
            }
            else {
              dVar29 = -dVar27 / dVar29;
            }
          }
          else {
            dVar29 = -dVar26 / dVar29;
          }
          if (local_c8 <= dVar30) {
            local_c8 = dVar30;
          }
          local_d0 = local_d0 + dVar30;
          if (1e-12 <= ABS(dVar29)) {
            dVar27 = dVar29 + dVar2;
            if (dVar29 + dVar2 <= dVar31) {
              dVar27 = dVar31;
            }
            if (dVar28 <= dVar27) {
              dVar27 = dVar28;
            }
            *(double *)((long)__s + lVar21 * 8) = dVar27;
            dVar27 = dVar27 - dVar2;
            if ((dVar27 != 0.0) || (NAN(dVar27))) {
              iVar5 = pfVar8->index;
              while (iVar5 != -1) {
                w[(long)iVar5 + -1] = pfVar8->value * dVar27 + w[(long)iVar5 + -1];
                iVar5 = pfVar8[1].index;
                pfVar8 = pfVar8 + 1;
              }
            }
          }
        }
        else {
          dVar30 = dVar26;
          if (dVar26 < 0.0) {
LAB_00109f8e:
            dVar30 = -dVar30;
            goto LAB_0010a006;
          }
          dVar30 = dVar27;
          if (((0.0 < dVar27) || (dVar30 = 0.0, dVar26 <= dVar23)) || (-dVar23 <= dVar27))
          goto LAB_0010a006;
LAB_0010a0cf:
          iVar19 = (int)uVar18;
          uVar18 = (ulong)(iVar19 - 1);
          *(undefined4 *)((long)pvVar12 + (long)iVar11 * 4) =
               *(undefined4 *)((long)pvVar12 + (long)iVar19 * 4 + -4);
          *(int *)((long)pvVar12 + (long)iVar19 * 4 + -4) = iVar5;
          iVar11 = iVar11 + -1;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < (int)uVar18);
    }
    dVar23 = local_d0;
    if (uVar10 != 0) {
      dVar23 = dVar25;
    }
    dVar25 = dVar23;
    uVar15 = uVar10 + 1;
    if ((uVar15 * -0x33333333 >> 1 | (uint)((uVar15 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)
    {
      info(".");
    }
    if (local_d0 <= dVar24 * dVar25) {
      if ((int)uVar18 == iVar3) goto LAB_0010a1c6;
      info("*");
      local_c8 = INFINITY;
      uVar18 = uVar20;
    }
    dVar23 = local_c8;
    uVar10 = uVar15;
  } while (uVar15 != 1000);
  uVar10 = 999;
  uVar15 = 1000;
LAB_0010a1c6:
  info("\noptimization finished, #iter = %d\n",(ulong)uVar15);
  if (0x3e6 < uVar10) {
    info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");
  }
  dVar24 = 0.0;
  if (0 < (int)uVar16) {
    uVar18 = 0;
    do {
      dVar24 = dVar24 + w[uVar18] * w[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
    dVar24 = dVar24 * 0.5;
  }
  if (iVar3 < 1) {
    uVar16 = 0;
  }
  else {
    uVar18 = 0;
    uVar16 = 0;
    do {
      dVar28 = *(double *)((long)__s + uVar18 * 8);
      dVar24 = dVar24 + dVar22 * 0.5 * dVar28 * dVar28 +
                        (ABS(dVar28) * dVar1 - pdVar6[uVar18] * dVar28);
      uVar16 = uVar16 + (dVar28 != 0.0);
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  info("Objective value = %lf\n",dVar24);
  info("nSV = %d\n",(ulong)uVar16);
  operator_delete__(__s);
  operator_delete__(pvVar13);
  operator_delete__(pvVar12);
  return;
}

Assistant:

static void solve_l2r_l1l2_svr(
	const problem *prob, double *w, const parameter *param,
	int solver_type)
{
	int l = prob->l;
	double C = param->C;
	double p = param->p;
	int w_size = prob->n;
	double eps = param->eps;
	int i, s, iter = 0;
	int max_iter = 1000;
	int active_size = l;
	int *index = new int[l];

	double d, G, H;
	double Gmax_old = INF;
	double Gmax_new, Gnorm1_new;
	double Gnorm1_init = -1.0; // Gnorm1_init is initialized at the first iteration
	double *beta = new double[l];
	double *QD = new double[l];
	double *y = prob->y;

	// L2R_L2LOSS_SVR_DUAL
	double lambda[1], upper_bound[1];
	lambda[0] = 0.5/C;
	upper_bound[0] = INF;

	if(solver_type == L2R_L1LOSS_SVR_DUAL)
	{
		lambda[0] = 0;
		upper_bound[0] = C;
	}

	// Initial beta can be set here. Note that
	// -upper_bound <= beta[i] <= upper_bound
	for(i=0; i<l; i++)
		beta[i] = 0;

	for(i=0; i<w_size; i++)
		w[i] = 0;
	for(i=0; i<l; i++)
	{
		QD[i] = 0;
		feature_node *xi = prob->x[i];
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;
			w[xi->index-1] += beta[i]*val;
			xi++;
		}

		index[i] = i;
	}


	while(iter < max_iter)
	{
		Gmax_new = 0;
		Gnorm1_new = 0;

		for(i=0; i<active_size; i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}

		for(s=0; s<active_size; s++)
		{
			i = index[s];
			G = -y[i] + lambda[GETI(i)]*beta[i];
			H = QD[i] + lambda[GETI(i)];

			feature_node *xi = prob->x[i];
			while(xi->index != -1)
			{
				int ind = xi->index-1;
				double val = xi->value;
				G += val*w[ind];
				xi++;
			}

			double Gp = G+p;
			double Gn = G-p;
			double violation = 0;
			if(beta[i] == 0)
			{
				if(Gp < 0)
					violation = -Gp;
				else if(Gn > 0)
					violation = Gn;
				else if(Gp>Gmax_old && Gn<-Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] >= upper_bound[GETI(i)])
			{
				if(Gp > 0)
					violation = Gp;
				else if(Gp < -Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] <= -upper_bound[GETI(i)])
			{
				if(Gn < 0)
					violation = -Gn;
				else if(Gn > Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] > 0)
				violation = fabs(Gp);
			else
				violation = fabs(Gn);

			Gmax_new = max(Gmax_new, violation);
			Gnorm1_new += violation;

			// obtain Newton direction d
			if(Gp < H*beta[i])
				d = -Gp/H;
			else if(Gn > H*beta[i])
				d = -Gn/H;
			else
				d = -beta[i];

			if(fabs(d) < 1.0e-12)
				continue;

			double beta_old = beta[i];
			beta[i] = min(max(beta[i]+d, -upper_bound[GETI(i)]), upper_bound[GETI(i)]);
			d = beta[i]-beta_old;

			if(d != 0)
			{
				xi = prob->x[i];
				while(xi->index != -1)
				{
					w[xi->index-1] += d*xi->value;
					xi++;
				}
			}
		}

		if(iter == 0)
			Gnorm1_init = Gnorm1_new;
		iter++;
		if(iter % 10 == 0)
			info(".");

		if(Gnorm1_new <= eps*Gnorm1_init)
		{
			if(active_size == l)
				break;
			else
			{
				active_size = l;
				info("*");
				Gmax_old = INF;
				continue;
			}
		}

		Gmax_old = Gmax_new;
	}

	info("\noptimization finished, #iter = %d\n", iter);
	if(iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0; i<w_size; i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0; i<l; i++)
	{
		v += p*fabs(beta[i]) - y[i]*beta[i] + 0.5*lambda[GETI(i)]*beta[i]*beta[i];
		if(beta[i] != 0)
			nSV++;
	}

	info("Objective value = %lf\n", v);
	info("nSV = %d\n",nSV);

	delete [] beta;
	delete [] QD;
	delete [] index;
}